

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op,
          BaseType input_type,BaseType expected_result_type)

{
  bool forwarding;
  SPIRType *pSVar1;
  SPIRType *pSVar2;
  string *this_00;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  string local_220;
  string expr;
  char *op_local;
  string cast_op;
  string local_1b0;
  SPIRType expected_type;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,input_type);
  op_local = op;
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op0);
  SPIRType::SPIRType(&expected_type,pSVar1);
  expected_type.width = pSVar2->width;
  cast_op._M_dataplus._M_p = (pointer)&cast_op.field_2;
  cast_op._M_string_length = 0;
  cast_op.field_2._M_local_buf[0] = '\0';
  expected_type.basetype = input_type;
  if (pSVar2->basetype == input_type) {
    to_unpacked_expression_abi_cxx11_(&expr,this,op0,true);
  }
  else {
    if (pSVar2->basetype == Boolean) {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_220,this,&expected_type,0);
      to_unpacked_expression_abi_cxx11_(&local_1b0,this,op0,true);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&expr,(spirv_cross *)&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3457d9,
                 (char (*) [2])&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3511f2,ts_3)
      ;
      ::std::__cxx11::string::operator=((string *)&cast_op,(string *)&expr);
      ::std::__cxx11::string::~string((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_1b0);
      this_00 = &local_220;
      goto LAB_00295dbe;
    }
    bitcast_glsl_abi_cxx11_(&expr,this,&expected_type,op0);
  }
  this_00 = &expr;
  ::std::__cxx11::string::operator=((string *)&cast_op,(string *)this_00);
LAB_00295dbe:
  ::std::__cxx11::string::~string((string *)this_00);
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  if (pSVar1->basetype == expected_result_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_220,(spirv_cross *)&op_local,(char **)0x3457d9,(char (*) [2])&cast_op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3511f2,ts_3);
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_220);
  }
  else {
    expected_type.basetype = expected_result_type;
    expected_type.width = pSVar1->width;
    if (pSVar1->basetype == Boolean) {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_220,this,pSVar1,0);
    }
    else {
      (*(this->super_Compiler)._vptr_Compiler[0x3c])(&local_220,this,pSVar1,&expected_type);
    }
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::push_back((char)&expr);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_220,(spirv_cross *)&op_local,(char **)0x3457d9,(char (*) [2])&cast_op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3511f2,ts_3);
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::push_back((char)&local_220 + ' ');
  }
  forwarding = should_forward(this,op0);
  emit_op(this,result_type,result_id,&expr,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  ::std::__cxx11::string::~string((string *)&expr);
  ::std::__cxx11::string::~string((string *)&cast_op);
  SPIRType::~SPIRType(&expected_type);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op,
                                           SPIRType::BaseType input_type, SPIRType::BaseType expected_result_type)
{
	auto &out_type = get<SPIRType>(result_type);
	auto &expr_type = expression_type(op0);
	auto expected_type = out_type;

	// Bit-widths might be different in unary cases because we use it for SConvert/UConvert and friends.
	expected_type.basetype = input_type;
	expected_type.width = expr_type.width;

	string cast_op;
	if (expr_type.basetype != input_type)
	{
		if (expr_type.basetype == SPIRType::Boolean)
			cast_op = join(type_to_glsl(expected_type), "(", to_unpacked_expression(op0), ")");
		else
			cast_op = bitcast_glsl(expected_type, op0);
	}
	else
		cast_op = to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.basetype = expected_result_type;
		expected_type.width = out_type.width;
		if (out_type.basetype == SPIRType::Boolean)
			expr = type_to_glsl(out_type);
		else
			expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}